

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Initialize(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
             *this)

{
  Memory *this_00;
  SimpleHashEntry<Js::JavascriptPromise_*,_int> **ppSVar1;
  DictionaryStats *pDVar2;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  data.plusSize = (size_t)this->size;
  local_38 = (undefined1  [8])&SimpleHashEntry<Js::JavascriptPromise*,int>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_26dcd30;
  data.filename._0_4_ = 0x41;
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_38);
  ppSVar1 = Memory::
            AllocateArray<Memory::HeapAllocator,SimpleHashEntry<Js::JavascriptPromise*,int>*,false>
                      (this_00,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(ulong)this->size
                      );
  this->table = ppSVar1;
  pDVar2 = DictionaryStats::Create
                     ("P15SimpleHashTableIPN2Js17JavascriptPromiseEiN6Memory13HeapAllocatorE15DefaultComparerLb0E14PowerOf2PolicyE"
                      ,this->size);
  this->stats = pDVar2;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }